

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skip_list.c
# Opt level: O0

ion_sl_level_t sl_gen_level(ion_skiplist_t *skiplist)

{
  bool bVar1;
  int iVar2;
  int local_14;
  ion_sl_level_t level;
  ion_skiplist_t *skiplist_local;
  
  local_14 = 1;
  while( true ) {
    iVar2 = rand();
    bVar1 = false;
    if (iVar2 < skiplist->pnum * (int)(0x7fffffff / (long)skiplist->pden)) {
      bVar1 = local_14 < skiplist->maxheight;
    }
    if (!bVar1) break;
    local_14 = local_14 + 1;
  }
  return local_14 + -1;
}

Assistant:

ion_sl_level_t
sl_gen_level(
	ion_skiplist_t *skiplist
) {
	ion_sl_level_t level = 1;

	while ((rand() < skiplist->pnum * (RAND_MAX / skiplist->pden)) && level < skiplist->maxheight) {
		level++;
	}

	return level - 1;
}